

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  N_Vector p_Var1;
  int local_2c;
  int j;
  N_Vector *vs;
  N_Vector w_local;
  N_Vector *pp_Stack_10;
  int count_local;
  
  if (count < 1) {
    pp_Stack_10 = (N_Vector *)0x0;
  }
  else {
    pp_Stack_10 = (N_Vector *)malloc((long)count << 3);
    if (pp_Stack_10 == (N_Vector *)0x0) {
      pp_Stack_10 = (N_Vector *)0x0;
    }
    else {
      for (local_2c = 0; local_2c < count; local_2c = local_2c + 1) {
        p_Var1 = N_VClone(w);
        pp_Stack_10[local_2c] = p_Var1;
        if (pp_Stack_10[local_2c] == (N_Vector)0x0) {
          N_VDestroyVectorArray(pp_Stack_10,local_2c + -1);
          return (N_Vector *)0x0;
        }
      }
    }
  }
  return pp_Stack_10;
}

Assistant:

N_Vector *N_VCloneVectorArray(int count, N_Vector w)
{
  N_Vector *vs = NULL;
  int j;

  if (count <= 0) return(NULL);

  vs = (N_Vector *) malloc(count * sizeof(N_Vector));
  if(vs == NULL) return(NULL);

  for (j = 0; j < count; j++) {
    vs[j] = N_VClone(w);
    if (vs[j] == NULL) {
      N_VDestroyVectorArray(vs, j-1);
      return(NULL);
    }
  }

  return(vs);
}